

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream,size_t UTimestep)

{
  long in_RDI;
  int j;
  SstMetaMetaList ret;
  int i;
  ssize_t LastRetTimestep;
  int RetCount;
  ssize_t Timestep;
  int local_44;
  int local_34;
  int local_24;
  SstMetaMetaList local_8;
  
  local_24 = 0;
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0xc0));
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x278); local_34 = local_34 + 1) {
    local_24 = local_24 + 1;
  }
  if (local_24 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0xc0));
    local_8 = (SstMetaMetaList)0x0;
  }
  else {
    local_8 = (SstMetaMetaList)malloc((long)(local_24 + 1) << 5);
    local_44 = 0;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x278); local_34 = local_34 + 1) {
      local_8[local_44].BlockData =
           *(char **)(*(long *)(in_RDI + 0x270) + (long)local_34 * 0x28 + 8);
      local_8[local_44].BlockSize =
           *(size_t *)(*(long *)(in_RDI + 0x270) + (long)local_34 * 0x28 + 0x10);
      local_8[local_44].ID = *(char **)(*(long *)(in_RDI + 0x270) + (long)local_34 * 0x28 + 0x18);
      local_8[local_44].IDSize =
           *(size_t *)(*(long *)(in_RDI + 0x270) + (long)local_34 * 0x28 + 0x20);
      local_44 = local_44 + 1;
    }
    memset(local_8 + local_44,0,0x20);
    pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0xc0));
  }
  return local_8;
}

Assistant:

extern SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream, size_t UTimestep)
{
    ssize_t Timestep = (ssize_t)UTimestep;
    int RetCount = 0;
    STREAM_MUTEX_LOCK(Stream);
    ssize_t LastRetTimestep = -1;
    int i;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
            RetCount++;
    }
    if (RetCount == 0)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        return NULL;
    }
    SstMetaMetaList ret = malloc(sizeof(ret[0]) * (RetCount + 1));
    int j = 0;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
        {
            // no copies, keep memory ownership in SST
            ret[j].BlockData = Stream->InternalMetaMetaInfo[i].BlockData;
            ret[j].BlockSize = Stream->InternalMetaMetaInfo[i].BlockSize;
            ret[j].ID = Stream->InternalMetaMetaInfo[i].ID;
            ret[j].IDSize = Stream->InternalMetaMetaInfo[i].IDSize;
            j++;
        }
    }
    memset(&ret[j], 0, sizeof(ret[j]));
    LastRetTimestep = Timestep;
    STREAM_MUTEX_UNLOCK(Stream);
    return ret;
}